

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O0

void __thiscall
ddd::DictionarySGL<true,_true>::DictionarySGL(DictionarySGL<true,_true> *this,istream *is)

{
  Dictionary *in_RDI;
  istream *in_stack_ffffffffffffffb8;
  unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
  *in_stack_ffffffffffffffc0;
  unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
  *this_00;
  basic_istream<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd8;
  unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
  local_18 [3];
  
  Dictionary::Dictionary(in_RDI);
  in_RDI->_vptr_Dictionary = (_func_int **)&PTR__DictionarySGL_001b48e8;
  std::unique_ptr<ddd::DaTrie<true,true,false>,std::default_delete<ddd::DaTrie<true,true,false>>>::
  unique_ptr<std::default_delete<ddd::DaTrie<true,true,false>>,void>(in_stack_ffffffffffffffc0);
  in_RDI[2]._vptr_Dictionary = (_func_int **)0x0;
  make_unique<ddd::DaTrie<true,true,false>,std::istream&>(in_stack_ffffffffffffffd8);
  this_00 = local_18;
  std::
  unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
  ::operator=(this_00,(unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
                       *)in_stack_ffffffffffffffb8);
  std::
  unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
  ::~unique_ptr(this_00);
  utils::read_value<unsigned_long>((unsigned_long *)this_00,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

DictionarySGL(std::istream& is) {
    trie_ = make_unique<TrieType>(is);
    utils::read_value(num_keys_, is);
  }